

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5Structure * fts5StructureRead(Fts5Index *p)

{
  u8 *puVar1;
  int iVar2;
  Fts5Config *pConfig;
  u8 *puVar3;
  uint *puVar4;
  ulong uVar5;
  u32 uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  i64 iVar11;
  Fts5Data *p_00;
  Fts5Structure *pFVar12;
  ulong uVar13;
  Fts5StructureSegment *pFVar14;
  u64 uVar15;
  ulong uVar16;
  ulong uVar17;
  Fts5StructureLevel *v;
  uint uVar18;
  u32 uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  u32 *v_00;
  u32 *v_01;
  long in_FS_OFFSET;
  bool bVar23;
  bool bVar24;
  int nLevel;
  int local_c8;
  ulong local_b8;
  u32 local_48;
  u32 local_44;
  u32 local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->pStruct != (Fts5Structure *)0x0) goto LAB_001e2cdc;
  iVar11 = fts5IndexDataVersion(p);
  p->iStructVersion = iVar11;
  if (p->rc != 0) goto LAB_001e2cdc;
  pConfig = p->pConfig;
  p_00 = fts5DataRead(p,10);
  pFVar12 = (Fts5Structure *)0x0;
  if (p->rc == 0) {
    puVar3 = p_00->p;
    iVar2 = p_00->nn;
    puVar1 = puVar3 + (long)iVar2 + 0x10;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar3 = puVar3 + iVar2;
    puVar3[0] = '\0';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    puVar3[4] = '\0';
    puVar3[5] = '\0';
    puVar3[6] = '\0';
    puVar3[7] = '\0';
    puVar3[8] = '\0';
    puVar3[9] = '\0';
    puVar3[10] = '\0';
    puVar3[0xb] = '\0';
    puVar3[0xc] = '\0';
    puVar3[0xd] = '\0';
    puVar3[0xe] = '\0';
    puVar3[0xf] = '\0';
    puVar4 = (uint *)p_00->p;
    iVar2 = p_00->nn;
    local_3c = 0;
    local_40 = 0;
    local_44 = 0;
    bVar23 = puVar4[1] == 0x10000ff;
    uVar18 = *puVar4;
    iVar9 = sqlite3Fts5GetVarint32((uchar *)(puVar4 + (ulong)bVar23 + 1),&local_40);
    iVar10 = sqlite3Fts5GetVarint32
                       ((uchar *)((ulong)(iVar9 + (uint)bVar23 * 4 + 4) + (long)puVar4),&local_44);
    uVar6 = local_40;
    uVar19 = local_44;
    uVar17 = (ulong)(int)local_40;
    iVar22 = 0x10b;
    if (local_44 < 0x7d1 && uVar17 < 0x7d1) {
      pFVar12 = (Fts5Structure *)sqlite3Fts5MallocZero(&local_3c,(uVar17 - 1) * 0x10 + 0x30);
      local_c8 = local_3c;
      if (pFVar12 == (Fts5Structure *)0x0) {
        p->rc = local_3c;
        if (local_3c == 0) goto LAB_001e2d20;
        pFVar12 = (Fts5Structure *)0x0;
      }
      else {
        uVar21 = iVar10 + 4 + iVar9 + (uint)bVar23 * 4;
        pFVar12->nRef = 1;
        pFVar12->nLevel = uVar6;
        pFVar12->nSegment = uVar19;
        bVar7 = sqlite3Fts5GetVarint
                          ((uchar *)((ulong)uVar21 + (long)puVar4),&pFVar12->nWriteCounter);
        bVar24 = local_c8 == 0;
        if (uVar6 == 0 || !bVar24) {
          uVar15 = 1;
        }
        else {
          iVar22 = uVar21 + bVar7;
          uVar16 = 0;
          local_b8 = 0;
          while( true ) {
            local_48 = 0;
            local_c8 = 0x10b;
            if (iVar2 <= iVar22) break;
            v = pFVar12->aLevel + uVar16;
            iVar9 = sqlite3Fts5GetVarint32((uchar *)((long)iVar22 + (long)puVar4),(u32 *)v);
            iVar10 = sqlite3Fts5GetVarint32
                               ((uchar *)((long)(iVar9 + iVar22) + (long)puVar4),&local_48);
            uVar6 = local_48;
            uVar13 = (ulong)local_48;
            if ((int)local_48 < v->nMerge) {
              local_3c = 0x10b;
            }
            pFVar14 = (Fts5StructureSegment *)
                      sqlite3Fts5MallocZero(&local_3c,(long)(int)local_48 * 0x38);
            v->aSeg = pFVar14;
            uVar19 = uVar19 - uVar6;
            local_c8 = local_3c;
            if (local_3c != 0) break;
            iVar22 = iVar9 + iVar22 + iVar10;
            v->nSeg = uVar6;
            local_c8 = 0;
            if (0 < (int)uVar6) {
              lVar20 = 0;
              do {
                if (iVar2 <= iVar22) {
LAB_001e2bcd:
                  local_3c = 0x10b;
                  local_c8 = 0x10b;
                  break;
                }
                pFVar14 = v->aSeg;
                iVar9 = sqlite3Fts5GetVarint32
                                  ((uchar *)((long)iVar22 + (long)puVar4),
                                   (u32 *)((long)&pFVar14->iSegid + lVar20));
                v_01 = (u32 *)((long)&pFVar14->pgnoFirst + lVar20);
                iVar10 = sqlite3Fts5GetVarint32
                                   ((uchar *)((long)puVar4 + (long)(iVar9 + iVar22)),v_01);
                iVar10 = iVar9 + iVar22 + iVar10;
                v_00 = (u32 *)((long)&pFVar14->pgnoLast + lVar20);
                iVar22 = sqlite3Fts5GetVarint32((uchar *)((long)puVar4 + (long)iVar10),v_00);
                iVar22 = iVar10 + iVar22;
                if (bVar23) {
                  bVar7 = sqlite3Fts5GetVarint
                                    ((uchar *)((long)puVar4 + (long)iVar22),
                                     (u64 *)((long)&pFVar14->iOrigin1 + lVar20));
                  bVar8 = sqlite3Fts5GetVarint
                                    ((uchar *)((long)puVar4 + (long)(int)(iVar22 + (uint)bVar7)),
                                     (u64 *)((long)&pFVar14->iOrigin2 + lVar20));
                  iVar22 = iVar22 + (uint)bVar7 + (uint)bVar8;
                  iVar9 = sqlite3Fts5GetVarint32
                                    ((uchar *)((long)puVar4 + (long)iVar22),
                                     (u32 *)((long)&pFVar14->nPgTombstone + lVar20));
                  iVar22 = iVar22 + iVar9;
                  bVar7 = sqlite3Fts5GetVarint
                                    ((uchar *)((long)puVar4 + (long)iVar22),
                                     (u64 *)((long)&pFVar14->nEntryTombstone + lVar20));
                  iVar22 = iVar22 + (uint)bVar7;
                  bVar7 = sqlite3Fts5GetVarint
                                    ((uchar *)((long)puVar4 + (long)iVar22),
                                     (u64 *)((long)&pFVar14->nEntry + lVar20));
                  iVar22 = iVar22 + (uint)bVar7;
                  uVar5 = *(ulong *)((long)&pFVar14->iOrigin2 + lVar20);
                  if (local_b8 <= uVar5) {
                    local_b8 = uVar5;
                  }
                }
                if ((int)*v_00 < (int)*v_01) goto LAB_001e2bcd;
                lVar20 = lVar20 + 0x38;
              } while (uVar13 * 0x38 != lVar20);
            }
            if (((uVar16 != 0) && (uVar6 == 0)) && ((int)*(u64 *)(v + -1) != 0)) {
              local_3c = 0x10b;
              local_c8 = 0x10b;
            }
            if ((uVar16 == (uVar17 - 1 & 0xffffffff)) && (v->nMerge != 0)) {
              local_c8 = 0x10b;
              break;
            }
            bVar24 = local_c8 == 0;
            if ((!bVar24) || (uVar16 = uVar16 + 1, uVar17 <= uVar16)) goto LAB_001e2c7b;
          }
          bVar24 = false;
LAB_001e2c7b:
          uVar15 = local_b8 + 1;
        }
        iVar22 = 0x10b;
        if (!bVar24) {
          iVar22 = local_c8;
        }
        if (uVar19 == 0) {
          iVar22 = local_c8;
        }
        if (bVar23) {
          pFVar12->nOriginCntr = uVar15;
        }
        if (iVar22 != 0) {
          fts5StructureRelease(pFVar12);
          goto LAB_001e2cac;
        }
        p->rc = 0;
LAB_001e2d20:
        uVar18 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18
        ;
        if ((pConfig->pgsz == 0) || (pConfig->iCookie != uVar18)) {
          iVar22 = sqlite3Fts5ConfigLoad(pConfig,uVar18);
          goto LAB_001e2cb9;
        }
      }
    }
    else {
LAB_001e2cac:
      pFVar12 = (Fts5Structure *)0x0;
LAB_001e2cb9:
      p->rc = iVar22;
    }
    sqlite3_free(p_00);
    if (p->rc != 0) {
      fts5StructureRelease(pFVar12);
      pFVar12 = (Fts5Structure *)0x0;
    }
  }
  p->pStruct = pFVar12;
LAB_001e2cdc:
  if (p->rc == 0) {
    pFVar12 = p->pStruct;
    pFVar12->nRef = pFVar12->nRef + 1;
  }
  else {
    pFVar12 = (Fts5Structure *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pFVar12;
}

Assistant:

static Fts5Structure *fts5StructureRead(Fts5Index *p){

  if( p->pStruct==0 ){
    p->iStructVersion = fts5IndexDataVersion(p);
    if( p->rc==SQLITE_OK ){
      p->pStruct = fts5StructureReadUncached(p);
    }
  }

#if 0
  else{
    Fts5Structure *pTest = fts5StructureReadUncached(p);
    if( pTest ){
      int i, j;
      assert_nc( p->pStruct->nSegment==pTest->nSegment );
      assert_nc( p->pStruct->nLevel==pTest->nLevel );
      for(i=0; i<pTest->nLevel; i++){
        assert_nc( p->pStruct->aLevel[i].nMerge==pTest->aLevel[i].nMerge );
        assert_nc( p->pStruct->aLevel[i].nSeg==pTest->aLevel[i].nSeg );
        for(j=0; j<pTest->aLevel[i].nSeg; j++){
          Fts5StructureSegment *p1 = &pTest->aLevel[i].aSeg[j];
          Fts5StructureSegment *p2 = &p->pStruct->aLevel[i].aSeg[j];
          assert_nc( p1->iSegid==p2->iSegid );
          assert_nc( p1->pgnoFirst==p2->pgnoFirst );
          assert_nc( p1->pgnoLast==p2->pgnoLast );
        }
      }
      fts5StructureRelease(pTest);
    }
  }
#endif

  if( p->rc!=SQLITE_OK ) return 0;
  assert( p->iStructVersion!=0 );
  assert( p->pStruct!=0 );
  fts5StructureRef(p->pStruct);
  return p->pStruct;
}